

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O1

void __thiscall HEkk::debugReportInitialBasis(HEkk *this)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  
  iVar5 = (this->lp_).num_col_;
  iVar16 = (this->lp_).num_row_ + iVar5;
  local_78 = 0;
  local_88 = 0;
  local_70 = 0;
  local_80 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < iVar5) {
    uVar13 = 0;
    uVar9 = 0;
    uVar8 = 0;
    local_80 = 0;
    local_70 = 0;
    local_88 = 0;
    do {
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar13] == '\0') {
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      else {
        cVar4 = (this->basis_).nonbasicMove_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13];
        if (cVar4 < '\x01') {
          if (cVar4 < '\0') {
            local_80 = (ulong)((int)local_80 + 1);
          }
          else {
            dVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar13];
            pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar13;
            if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
              local_88 = (ulong)((int)local_88 + 1);
            }
            else {
              local_70 = (ulong)((int)local_70 + 1);
            }
          }
        }
        else {
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        if (iVar16 < 0x19) {
          highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                      "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                      (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13],
                      (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13],
                      (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13],uVar13 & 0xffffffff,uVar8,
                      local_80,local_70,local_88);
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)(this->lp_).num_col_);
  }
  uVar6 = (this->lp_).num_row_;
  local_68 = 0;
  uVar13 = 0;
  uVar14 = 0;
  uVar15 = 0;
  if (0 < (int)uVar6) {
    uVar10 = 0;
    uVar15 = 0;
    uVar14 = 0;
    uVar13 = 0;
    local_68 = 0;
    local_78 = 0;
    do {
      lVar7 = (long)(this->lp_).num_col_;
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar10 + lVar7] == '\0') {
        uVar15 = (ulong)((int)uVar15 + 1);
      }
      else {
        lVar2 = lVar7 + uVar10;
        cVar4 = (this->basis_).nonbasicMove_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10 + lVar7];
        if (cVar4 < '\x01') {
          if (cVar4 < '\0') {
            uVar13 = (ulong)((int)uVar13 + 1);
          }
          else {
            dVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2];
            pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar2;
            if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
              local_68 = (ulong)((int)local_68 + 1);
            }
            else {
              local_78 = (ulong)((int)local_78 + 1);
            }
          }
        }
        else {
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        if (iVar16 < 0x19) {
          highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                      "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                      (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2],
                      (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2],
                      (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2],uVar10 & 0xffffffff,uVar14,
                      uVar13,local_78,local_68);
        }
      }
      uVar6 = (this->lp_).num_row_;
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < (int)uVar6);
  }
  uVar11 = (int)local_80 + (int)uVar8 + (int)local_70 + (int)local_88;
  uVar12 = (int)uVar13 + (int)uVar14 + (int)local_68 + (int)local_78;
  highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
              "For %d columns and %d rows\n   NonBasic |  Lower  Upper  Fixed   Free |    Basic\nCol %7d |%7d%7d%7d%7d |  %7d\nRow %7d |%7d%7d%7d%7d |  %7d\n----------------------------------------------------\n    %7d |%7d%7d%7d%7d |  %7d\n"
              ,(ulong)(uint)(this->lp_).num_col_,(ulong)uVar6,(ulong)uVar11,uVar8,local_80,local_70,
              local_88,uVar9,(ulong)uVar12,uVar14,uVar13,local_78,local_68,uVar15,
              (ulong)(uVar12 + uVar11),(ulong)(uint)((int)uVar8 + (int)uVar14),
              (ulong)(uint)((int)uVar13 + (int)local_80),
              (ulong)(uint)((int)local_78 + (int)local_70),
              (ulong)(uint)((int)local_88 + (int)local_68),(ulong)(uint)((int)uVar9 + (int)uVar15));
  return;
}

Assistant:

void HEkk::debugReportInitialBasis() {
  HighsInt num_col_basic = 0;
  HighsInt num_col_lower = 0;
  HighsInt num_col_upper = 0;
  HighsInt num_col_fixed = 0;
  HighsInt num_col_free = 0;
  HighsInt num_row_basic = 0;
  HighsInt num_row_lower = 0;
  HighsInt num_row_upper = 0;
  HighsInt num_row_fixed = 0;
  HighsInt num_row_free = 0;
  std::vector<double>& lower = info_.workLower_;
  std::vector<double>& upper = info_.workUpper_;
  std::vector<double>& value = info_.workValue_;
  const bool detail = lp_.num_col_ + lp_.num_row_ < 25;
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    HighsInt iVar = iCol;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_col_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_col_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_col_upper++;
    } else if (lower[iCol] == upper[iCol]) {
      num_col_fixed++;
    } else {
      num_col_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iCol, lower[iCol], value[iVar], upper[iCol],
                  num_col_lower, num_col_upper, num_col_fixed, num_col_free);
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = lp_.num_col_ + iRow;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_row_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_row_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_row_upper++;
    } else if (lower[iVar] == upper[iVar]) {
      num_row_fixed++;
    } else {
      num_row_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iRow, lower[iVar], value[iVar], upper[iVar],
                  num_row_lower, num_row_upper, num_row_fixed, num_row_free);
  }
  HighsInt num_col_nonbasic =
      num_col_lower + num_col_upper + num_col_fixed + num_col_free;
  HighsInt num_row_nonbasic =
      num_row_lower + num_row_upper + num_row_fixed + num_row_free;
  assert(num_col_basic + num_row_basic == lp_.num_row_);
  assert(num_col_nonbasic + num_row_nonbasic == lp_.num_col_);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "For %d columns and %d rows\n"
              "   NonBasic |  Lower  Upper  Fixed   Free |    Basic\n"
              "Col %7d |%7d%7d%7d%7d |  %7d\n"
              "Row %7d |%7d%7d%7d%7d |  %7d\n"
              "----------------------------------------------------\n"
              "    %7d |%7d%7d%7d%7d |  %7d\n",
              (int)lp_.num_col_, (int)lp_.num_row_, (int)num_col_nonbasic,
              (int)num_col_lower, (int)num_col_upper, (int)num_col_fixed,
              (int)num_col_free, (int)num_col_basic, (int)num_row_nonbasic,
              (int)num_row_lower, (int)num_row_upper, (int)num_row_fixed,
              (int)num_row_free, (int)num_row_basic,
              (int)num_col_nonbasic + (int)num_row_nonbasic,
              (int)num_col_lower + (int)num_row_lower,
              (int)num_col_upper + (int)num_row_upper,
              (int)num_col_fixed + (int)num_row_fixed,
              (int)num_col_free + (int)num_row_free,
              (int)num_col_basic + (int)num_row_basic);
}